

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,
                 parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  parasail_result_t *ppVar7;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong size;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong size_00;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int NWL;
  int NWS;
  int NWM;
  int local_f0;
  int local_ec;
  int local_e8;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_cold_8();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_nw_stats_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_nw_stats_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_nw_stats_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_stats_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_nw_stats_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_00550397;
  }
  _s1Len = matrix->length;
LAB_00550397:
  ppVar7 = parasail_result_new_stats();
  if (ppVar7 != (parasail_result_t *)0x0) {
    ppVar7->flag = ppVar7->flag | 0x1410101;
    ptr = parasail_memalign_int(0x10,(long)_s1Len);
    size = (ulong)(uint)s2Len;
    ptr_00 = parasail_memalign_int(0x10,size);
    size_00 = (ulong)(s2Len + 1);
    ptr_01 = parasail_memalign_int(0x10,size_00);
    ptr_02 = parasail_memalign_int(0x10,size_00);
    ptr_03 = parasail_memalign_int(0x10,size_00);
    ptr_04 = parasail_memalign_int(0x10,size_00);
    ptr_05 = parasail_memalign_int(0x10,size_00);
    ptr_06 = parasail_memalign_int(0x10,size_00);
    ptr_07 = parasail_memalign_int(0x10,size_00);
    ptr_08 = parasail_memalign_int(0x10,size_00);
    auVar28._0_4_ = -(uint)((int)ptr == 0);
    auVar28._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
    auVar28._8_4_ = -(uint)((int)ptr_00 == 0);
    auVar28._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
    auVar30._4_4_ = auVar28._0_4_;
    auVar30._0_4_ = auVar28._4_4_;
    auVar30._8_4_ = auVar28._12_4_;
    auVar30._12_4_ = auVar28._8_4_;
    auVar31._0_4_ = -(uint)((int)ptr_01 == 0);
    auVar31._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
    auVar31._8_4_ = -(uint)((int)ptr_02 == 0);
    auVar31._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
    auVar29._4_4_ = auVar31._0_4_;
    auVar29._0_4_ = auVar31._4_4_;
    auVar29._8_4_ = auVar31._12_4_;
    auVar29._12_4_ = auVar31._8_4_;
    auVar31 = packssdw(auVar30 & auVar28,auVar29 & auVar31);
    auVar24._0_4_ = -(uint)((int)ptr_03 == 0);
    auVar24._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
    auVar24._8_4_ = -(uint)((int)ptr_04 == 0);
    auVar24._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
    auVar26._4_4_ = auVar24._0_4_;
    auVar26._0_4_ = auVar24._4_4_;
    auVar26._8_4_ = auVar24._12_4_;
    auVar26._12_4_ = auVar24._8_4_;
    auVar27._0_4_ = -(uint)((int)ptr_05 == 0);
    auVar27._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
    auVar27._8_4_ = -(uint)((int)ptr_06 == 0);
    auVar27._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
    auVar25._4_4_ = auVar27._0_4_;
    auVar25._0_4_ = auVar27._4_4_;
    auVar25._8_4_ = auVar27._12_4_;
    auVar25._12_4_ = auVar27._8_4_;
    auVar27 = packssdw(auVar26 & auVar24,auVar25 & auVar27);
    auVar27 = packssdw(auVar31,auVar27);
    if ((ptr_08 != (int *)0x0 && ptr_07 != (int *)0x0) &&
        ((((((((auVar27 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar27 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar27 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar27 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar27[0xf]))
    {
      if (0 < _s1Len) {
        piVar5 = matrix->mapper;
        uVar11 = 0;
        do {
          ptr[uVar11] = piVar5[(byte)_s1[uVar11]];
          uVar11 = uVar11 + 1;
        } while ((uint)_s1Len != uVar11);
      }
      piVar5 = matrix->mapper;
      uVar11 = 0;
      do {
        ptr_00[uVar11] = piVar5[(byte)_s2[uVar11]];
        uVar11 = uVar11 + 1;
      } while (size != uVar11);
      *ptr_01 = 0;
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_05 = -0x40000000;
      *ptr_06 = 0;
      *ptr_07 = 0;
      *ptr_08 = 0;
      iVar8 = -open;
      lVar12 = 0;
      do {
        ptr_01[lVar12 + 1] = iVar8;
        ptr_02[lVar12 + 1] = 0;
        ptr_03[lVar12 + 1] = 0;
        ptr_04[lVar12 + 1] = 0;
        ptr_05[lVar12 + 1] = -0x40000000;
        ptr_06[lVar12 + 1] = 0;
        ptr_07[lVar12 + 1] = 0;
        ptr_08[lVar12 + 1] = 0;
        iVar8 = iVar8 - gap;
        lVar12 = lVar12 + 1;
      } while (size_00 - 1 != lVar12);
      if (0 < _s1Len) {
        piVar5 = matrix->matrix;
        uVar11 = 1;
        do {
          if (matrix->type == 0) {
            lVar12 = (long)ptr[uVar11 - 1];
          }
          else {
            lVar12 = uVar11 - 1;
          }
          lVar12 = matrix->size * lVar12;
          iVar8 = *ptr_01;
          iVar23 = *ptr_02;
          iVar20 = *ptr_03;
          iVar13 = *ptr_04;
          iVar10 = -((int)(uVar11 - 1) * gap + open);
          *ptr_01 = iVar10;
          lVar19 = 0;
          *ptr_02 = 0;
          *ptr_03 = 0;
          *ptr_04 = 0;
          iVar14 = -0x40000000;
          local_e8 = 0;
          local_ec = 0;
          local_f0 = 0;
          iVar17 = 0;
          iVar15 = 0;
          iVar6 = 0;
          do {
            iVar1 = ptr_01[lVar19 + 1];
            iVar2 = ptr_02[lVar19 + 1];
            iVar3 = ptr_03[lVar19 + 1];
            iVar21 = iVar1 - open;
            iVar9 = ptr_05[lVar19 + 1] - gap;
            iVar22 = iVar9;
            if (iVar9 < iVar21) {
              iVar22 = iVar21;
            }
            iVar4 = ptr_04[lVar19 + 1];
            ptr_05[lVar19 + 1] = iVar22;
            iVar16 = iVar10 - open;
            iVar18 = iVar14 - gap;
            iVar14 = iVar16;
            if (iVar16 <= iVar18) {
              iVar14 = iVar18;
            }
            iVar8 = iVar8 + piVar5[lVar12 + ptr_00[lVar19]];
            iVar10 = iVar14;
            if (iVar14 < iVar8) {
              iVar10 = iVar8;
            }
            if (iVar10 <= iVar22) {
              iVar10 = iVar22;
            }
            if (iVar9 < iVar21) {
              ptr_06[lVar19 + 1] = iVar2;
              ptr_07[lVar19 + 1] = iVar3;
              iVar22 = iVar4;
            }
            else {
              iVar22 = ptr_08[lVar19 + 1];
            }
            ptr_08[lVar19 + 1] = iVar22 + 1;
            iVar9 = iVar15;
            iVar21 = iVar6;
            if (iVar16 <= iVar18) {
              iVar9 = local_ec;
              iVar21 = local_f0;
              iVar17 = local_e8;
            }
            local_e8 = iVar17 + 1;
            if (iVar10 == iVar8) {
              iVar15 = iVar20 + (uint)(0 < piVar5[lVar12 + ptr_00[lVar19]]);
              iVar6 = iVar23 + (uint)(ptr[uVar11 - 1] == ptr_00[lVar19]);
              iVar17 = iVar13 + 1;
            }
            else {
              iVar15 = iVar9;
              iVar6 = iVar21;
              iVar17 = local_e8;
              if (iVar10 == ptr_05[lVar19 + 1]) {
                iVar6 = ptr_06[lVar19 + 1];
                iVar15 = ptr_07[lVar19 + 1];
                iVar17 = iVar22 + 1;
              }
            }
            ptr_01[lVar19 + 1] = iVar10;
            ptr_02[lVar19 + 1] = iVar6;
            ptr_03[lVar19 + 1] = iVar15;
            ptr_04[lVar19 + 1] = iVar17;
            lVar19 = lVar19 + 1;
            iVar8 = iVar1;
            iVar23 = iVar2;
            iVar20 = iVar3;
            iVar13 = iVar4;
            local_f0 = iVar21;
            local_ec = iVar9;
          } while (size_00 - 1 != lVar19);
          uVar11 = uVar11 + 1;
        } while (uVar11 != _s1Len + 1);
      }
      ppVar7->score = ptr_01[size];
      ppVar7->end_query = _s1Len - 1;
      ppVar7->end_ref = s2Len + -1;
      ((ppVar7->field_4).stats)->matches = ptr_02[size];
      ((ppVar7->field_4).stats)->similar = ptr_03[size];
      ((ppVar7->field_4).stats)->length = ptr_04[size];
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar7;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict HM = NULL;
    int * restrict HS = NULL;
    int * restrict HL = NULL;
    int * restrict F = NULL;
    int * restrict FM = NULL;
    int * restrict FS = NULL;
    int * restrict FL = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    HM = parasail_memalign_int(16, s2Len+1);
    HS = parasail_memalign_int(16, s2Len+1);
    HL = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);
    FM = parasail_memalign_int(16, s2Len+1);
    FS = parasail_memalign_int(16, s2Len+1);
    FL = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!HM) return NULL;
    if (!HS) return NULL;
    if (!HL) return NULL;
    if (!F) return NULL;
    if (!FM) return NULL;
    if (!FS) return NULL;
    if (!FL) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    HM[0] = 0;
    HS[0] = 0;
    HL[0] = 0;
    F[0] = NEG_INF_32;
    FM[0] = 0;
    FS[0] = 0;
    FL[0] = 0;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = -open - (j-1)*gap;
        HM[j] = 0;
        HS[j] = 0;
        HL[j] = 0;
        F[j] = NEG_INF_32;
        FM[j] = 0;
        FS[j] = 0;
        FL[j] = 0;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int NHM = HM[0];
        int NHS = HS[0];
        int NHL = HL[0];
        int WH = -open - (i-1)*gap;
        int WHM = 0;
        int WHS = 0;
        int WHL = 0;
        int E = NEG_INF_32;
        int EM = 0;
        int ES = 0;
        int EL = 0;
        H[0] = WH;
        HM[0] = WHM;
        HS[0] = WHS;
        HL[0] = WHL;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int H_new;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            int NWM = NHM;
            int NWS = NHS;
            int NWL = NHL;
            NH = H[j];
            NHM = HM[j];
            NHS = HS[j];
            NHL = HL[j];
            F_opn = NH - open;
            F_ext  = F[j] - gap;
            F[j]  = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            H_new = MAX(H_dag, E);
            H_new = MAX(H_new, F[j]);
            if (F_opn > F_ext) {
                FM[j] = NHM;
                FS[j] = NHS;
                FL[j] = NHL;
            }
            FL[j] += 1;
            if (E_opn > E_ext) {
                EM = WHM;
                ES = WHS;
                EL = WHL;
            }
            EL += 1;
            WH = H_new;
            if (H_new == H_dag) {
                WHM  = NWM + (s1[i-1] == s2[j-1]);
                WHS  = NWS + (matrow[s2[j-1]] > 0);
                WHL  = NWL + 1;
            }
            else if (H_new == F[j]) {
                WHM  = FM[j];
                WHS  = FS[j];
                WHL  = FL[j];
            }
            else {
                WHM  = EM;
                WHS  = ES;
                WHL  = EL;
            }
            H[j] = WH;
            HM[j] = WHM;
            HS[j] = WHS;
            HL[j] = WHL;
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
            result->stats->tables->matches_table[1LL*(i-1)*s2Len + (j-1)] = WHM;
            result->stats->tables->similar_table[1LL*(i-1)*s2Len + (j-1)] = WHS;
            result->stats->tables->length_table[1LL*(i-1)*s2Len + (j-1)] = WHL;
#endif
        }
#ifdef PARASAIL_ROWCOL
        result->stats->rowcols->score_col[i-1] = WH;
        result->stats->rowcols->matches_col[i-1] = WHM;
        result->stats->rowcols->similar_col[i-1] = WHS;
        result->stats->rowcols->length_col[i-1] = WHL;
#endif
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->stats->rowcols->score_row[j-1] = H[j];
        result->stats->rowcols->matches_row[j-1] = HM[j];
        result->stats->rowcols->similar_row[j-1] = HS[j];
        result->stats->rowcols->length_row[j-1] = HL[j];
    }
#endif

    result->score = H[s2Len];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;
    result->stats->matches = HM[s2Len];
    result->stats->similar = HS[s2Len];
    result->stats->length = HL[s2Len];

    parasail_free(FL);
    parasail_free(FS);
    parasail_free(FM);
    parasail_free(F);
    parasail_free(HL);
    parasail_free(HS);
    parasail_free(HM);
    parasail_free(H);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}